

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O1

void * google::protobuf::internal::TcParser::MaybeGetSplitBase
                 (MessageLite *msg,bool is_split,TcParseTableBase *table)

{
  void *__src;
  undefined8 *puVar1;
  void *__dest;
  undefined8 *puVar2;
  undefined7 in_register_00000031;
  Arena *this;
  ulong __n;
  
  if ((int)CONCAT71(in_register_00000031,is_split) != 0) {
    puVar1 = (undefined8 *)
             ((long)&table->class_data->prototype->_vptr_MessageLite +
             (ulong)*(uint *)(&table->fast_idx_mask + table->aux_offset));
    if (((ulong)puVar1 & 7) != 0) {
      AlignFail(puVar1);
    }
    puVar2 = (undefined8 *)
             ((long)&msg->_vptr_MessageLite +
             (ulong)*(uint *)(&table->fast_idx_mask + table->aux_offset));
    if (((ulong)puVar2 & 7) != 0) {
      AlignFail(puVar2);
    }
    __src = (void *)*puVar1;
    if ((void *)*puVar2 == __src) {
      __n = (ulong)*(uint *)((long)&table->field_entries_offset + (ulong)table->aux_offset);
      this = (Arena *)(msg->_internal_metadata_).ptr_;
      if (((ulong)this & 1) != 0) {
        this = *(Arena **)((ulong)this & 0xfffffffffffffffe);
      }
      if (this == (Arena *)0x0) {
        __dest = operator_new(__n);
      }
      else {
        __dest = Arena::Allocate(this,__n + 7 & 0xfffffffffffffff8);
      }
      *puVar2 = __dest;
      memcpy(__dest,__src,__n);
    }
    msg = (MessageLite *)*puVar2;
  }
  return msg;
}

Assistant:

void* TcParser::MaybeGetSplitBase(MessageLite* msg, const bool is_split,
                                  const TcParseTableBase* table) {
  void* out = msg;
  if (is_split) {
    const uint32_t split_offset = GetSplitOffset(table);
    void* default_split =
        TcParser::RefAt<void*>(table->default_instance(), split_offset);
    void*& split = TcParser::RefAt<void*>(msg, split_offset);
    if (split == default_split) {
      // Allocate split instance when needed.
      uint32_t size = GetSizeofSplit(table);
      Arena* arena = msg->GetArena();
      split = (arena == nullptr) ? ::operator new(size)
                                 : arena->AllocateAligned(size);
      memcpy(split, default_split, size);
    }
    out = split;
  }
  return out;
}